

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRTreeBuildVisitor.cpp
# Opt level: O2

void __thiscall IRTreeBuildVisitor::Visit(IRTreeBuildVisitor *this,PrintStatement *statement)

{
  int iVar1;
  ExpressionList *this_00;
  SubtreeWrapper *pSVar2;
  undefined4 extraout_var;
  CallExpression *this_01;
  NameExpression *this_02;
  allocator<char> local_79;
  ExpressionWrapper *local_78;
  string local_70;
  Label local_50;
  
  this_00 = (ExpressionList *)operator_new(0x20);
  (this_00->super_BaseElement)._vptr_BaseElement = (_func_int **)&PTR__ExpressionList_00161f48;
  (this_00->expressions_).super__Vector_base<IRT::Expression_*,_std::allocator<IRT::Expression_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->expressions_).super__Vector_base<IRT::Expression_*,_std::allocator<IRT::Expression_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->expressions_).super__Vector_base<IRT::Expression_*,_std::allocator<IRT::Expression_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pSVar2 = TemplateVisitor<IRT::SubtreeWrapper_*>::Accept
                     (&this->super_TemplateVisitor<IRT::SubtreeWrapper_*>,
                      &statement->expression_->super_Node);
  iVar1 = (*pSVar2->_vptr_SubtreeWrapper[2])(pSVar2);
  IRT::ExpressionList::Add(this_00,(Expression *)CONCAT44(extraout_var,iVar1));
  local_78 = (ExpressionWrapper *)operator_new(0x10);
  this_01 = (CallExpression *)operator_new(0x18);
  this_02 = (NameExpression *)operator_new(0x28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"print",&local_79);
  IRT::Label::Label(&local_50,&local_70);
  IRT::NameExpression::NameExpression(this_02,&local_50);
  IRT::CallExpression::CallExpression(this_01,(Expression *)this_02,this_00);
  IRT::ExpressionWrapper::ExpressionWrapper(local_78,(Expression *)this_01);
  (this->super_TemplateVisitor<IRT::SubtreeWrapper_*>).tos_value_ = &local_78->super_SubtreeWrapper;
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  return;
}

Assistant:

void IRTreeBuildVisitor::Visit(PrintStatement* statement) {
  auto* irt_expressions = new IRT::ExpressionList();
  irt_expressions->Add(Accept(statement->expression_)->ToExpression());

  tos_value_ = new IRT::ExpressionWrapper(new IRT::CallExpression(
      new IRT::NameExpression(IRT::Label("print")), irt_expressions));
}